

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

void duckdb::BitwiseXOROperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar6;
  byte bVar7;
  anon_struct_16_3_d7536bce_for_pointer aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Vector *pVVar11;
  reference vector;
  reference vector_00;
  idx_t iVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  ulong uVar15;
  idx_t iVar16;
  idx_t extraout_RDX;
  anon_union_16_2_67f50693_for_value *extraout_RDX_00;
  idx_t extraout_RDX_01;
  anon_union_16_2_67f50693_for_value *extraout_RDX_02;
  anon_union_16_2_67f50693_for_value *paVar17;
  anon_union_16_2_67f50693_for_value *len;
  anon_union_16_2_67f50693_for_value *extraout_RDX_03;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  idx_t extraout_RDX_06;
  idx_t extraout_RDX_07;
  idx_t extraout_RDX_08;
  idx_t extraout_RDX_09;
  ulong uVar18;
  data_ptr_t pdVar19;
  data_ptr_t pdVar20;
  idx_t idx_in_entry;
  ulong uVar21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  string_t target_7;
  string_t target;
  undefined1 local_138 [16];
  data_ptr_t local_128;
  data_ptr_t local_120;
  idx_t local_118;
  data_ptr_t local_110;
  anon_struct_16_3_d7536bce_for_pointer *local_108;
  Vector *local_100;
  data_ptr_t local_f8;
  ulong local_f0;
  anon_union_16_2_67f50693_for_value local_e8;
  long local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  anon_union_16_2_67f50693_for_value local_a0;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  anon_union_16_2_67f50693_for_value local_58;
  ulong local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar19 = result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      local_a0._0_8_ = *(undefined8 *)vector->data;
      local_a0.pointer.ptr = (char *)*(ulong *)((long)vector->data + 8);
      local_138 = *(undefined1 (*) [16])vector_00->data;
      local_e8.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString
                     ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),local_a0._0_8_)
      ;
      Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                      (bitstring_t *)&local_e8.pointer);
      *(undefined8 *)pdVar19 = local_e8._0_8_;
      *(char **)(pdVar19 + 8) = local_e8.pointer.ptr;
      return;
    }
  }
  else {
    iVar23 = args->count;
    local_118 = iVar23;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      local_108 = (anon_struct_16_3_d7536bce_for_pointer *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_100 = (Vector *)vector->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        local_128 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar23 == 0) {
            return;
          }
          aVar8 = *local_108;
          lVar25 = 8;
          iVar23 = extraout_RDX;
          do {
            local_a0._0_8_ = *(ulong *)((long)local_100 + lVar25 + -8);
            local_a0.pointer.ptr = (char *)*(undefined8 *)(&local_100->vector_type + lVar25);
            local_138 = (undefined1  [16])aVar8;
            local_e8.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString
                           ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),iVar23);
            Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                            (bitstring_t *)&local_e8.pointer);
            *(undefined8 *)(local_128 + lVar25 + -8) = local_e8._0_8_;
            *(char **)(local_128 + lVar25 + -8 + 8) = local_e8.pointer.ptr;
            lVar25 = lVar25 + 0x10;
            local_118 = local_118 - 1;
            iVar23 = extraout_RDX_04;
          } while (local_118 != 0);
          return;
        }
        if (iVar23 + 0x3f < 0x40) {
          return;
        }
        uVar15 = iVar23 + 0x3f >> 6;
        local_120 = (data_ptr_t)0x0;
        uVar22 = 0;
        local_f0 = uVar15;
        do {
          pVVar11 = local_100;
          pdVar19 = local_128;
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar18 = uVar22 + 0x40;
            if (local_118 <= uVar22 + 0x40) {
              uVar18 = local_118;
            }
LAB_01adbf37:
            uVar24 = uVar22;
            if (uVar22 < uVar18) {
              local_f8._0_4_ = local_108->length;
              local_f8._4_1_ = local_108->prefix[0];
              local_f8._5_1_ = local_108->prefix[1];
              local_f8._6_1_ = local_108->prefix[2];
              local_f8._7_1_ = local_108->prefix[3];
              local_110 = (data_ptr_t)local_108->ptr;
              uVar27 = uVar22 << 4 | 8;
              paVar17 = &local_a0;
              do {
                local_a0._0_8_ = *(ulong *)((long)pVVar11 + (uVar27 - 8));
                local_a0.pointer.ptr = (char *)*(undefined8 *)(&pVVar11->vector_type + uVar27);
                local_138._8_8_ = local_110;
                local_138._0_8_ = local_f8;
                local_e8.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringVector::EmptyString
                               ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),
                                (idx_t)paVar17);
                Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                                (bitstring_t *)&local_e8.pointer);
                pdVar20 = pdVar19 + (uVar27 - 8);
                *(undefined8 *)pdVar20 = local_e8._0_8_;
                *(char **)(pdVar20 + 8) = local_e8.pointer.ptr;
                uVar22 = uVar22 + 1;
                uVar27 = uVar27 + 0x10;
                uVar15 = local_f0;
                paVar17 = extraout_RDX_00;
                uVar24 = uVar18;
              } while (uVar18 != uVar22);
            }
          }
          else {
            uVar27 = puVar4[(long)local_120];
            uVar18 = uVar22 + 0x40;
            if (local_118 <= uVar22 + 0x40) {
              uVar18 = local_118;
            }
            uVar24 = uVar18;
            if (uVar27 != 0) {
              if (uVar27 == 0xffffffffffffffff) goto LAB_01adbf37;
              uVar24 = uVar22;
              if (uVar22 < uVar18) {
                uVar21 = uVar22 << 4 | 8;
                uVar26 = 0;
                do {
                  if ((uVar27 >> (uVar26 & 0x3f) & 1) != 0) {
                    local_a0._0_8_ = *(ulong *)((long)local_100 + (uVar21 - 8));
                    local_a0.pointer.ptr = (char *)*(undefined8 *)(&local_100->vector_type + uVar21)
                    ;
                    local_138 = *(undefined1 (*) [16])local_108;
                    local_e8.pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)
                         StringVector::EmptyString
                                   ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),
                                    (idx_t)local_108);
                    Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                                    (bitstring_t *)&local_e8.pointer);
                    pdVar20 = pdVar19 + (uVar21 - 8);
                    *(undefined8 *)pdVar20 = local_e8._0_8_;
                    *(char **)(pdVar20 + 8) = local_e8.pointer.ptr;
                  }
                  uVar26 = uVar26 + 1;
                  uVar21 = uVar21 + 0x10;
                  uVar15 = local_f0;
                  uVar24 = uVar18;
                } while (uVar18 - uVar22 != uVar26);
              }
            }
          }
          local_120 = (data_ptr_t)((long)local_120 + 1);
          uVar22 = uVar24;
          if (local_120 == (data_ptr_t)uVar15) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          local_f8 = vector->data;
          local_110 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          local_100 = (Vector *)result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          local_108 = (anon_struct_16_3_d7536bce_for_pointer *)&result->validity;
          ValidityMask::Combine(&result->validity,&vector_00->validity,iVar23);
          pVVar11 = local_100;
          pdVar19 = local_110;
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar23 != 0) {
              lVar25 = 8;
              iVar23 = extraout_RDX_05;
              do {
                local_a0._0_8_ = *(undefined8 *)(local_f8 + lVar25 + -8);
                local_a0.pointer.ptr = (char *)*(undefined8 *)(local_f8 + lVar25);
                local_138 = *(undefined1 (*) [16])(pdVar19 + lVar25 + -8);
                local_e8.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringVector::EmptyString
                               ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),
                                iVar23);
                Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                                (bitstring_t *)&local_e8.pointer);
                *(undefined8 *)((long)pVVar11 + lVar25 + -8) = local_e8._0_8_;
                *(char **)((data_ptr_t)((long)pVVar11 + lVar25 + -8) + 8) = local_e8.pointer.ptr;
                lVar25 = lVar25 + 0x10;
                local_118 = local_118 - 1;
                iVar23 = extraout_RDX_09;
              } while (local_118 != 0);
            }
          }
          else if (0x3f < iVar23 + 0x3f) {
            pdVar20 = (data_ptr_t)(iVar23 + 0x3f >> 6);
            local_128 = (data_ptr_t)0x0;
            iVar23 = extraout_RDX_05;
            uVar15 = 0;
            local_120 = pdVar20;
            do {
              pdVar1 = local_f8;
              pVVar11 = local_100;
              puVar4 = ((TemplatedValidityMask<unsigned_long> *)&local_108->length)->validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar22 = uVar15 + 0x40;
                if (local_118 <= uVar15 + 0x40) {
                  uVar22 = local_118;
                }
LAB_01adc559:
                uVar27 = uVar15;
                if (uVar15 < uVar22) {
                  uVar18 = uVar15 << 4 | 8;
                  do {
                    local_a0._0_8_ = *(undefined8 *)(pdVar1 + (uVar18 - 8));
                    local_a0.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + uVar18);
                    local_138 = *(undefined1 (*) [16])(pdVar19 + (uVar18 - 8));
                    local_e8.pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)
                         StringVector::EmptyString
                                   ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),
                                    iVar23);
                    Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                                    (bitstring_t *)&local_e8.pointer);
                    *(undefined8 *)((long)pVVar11 + (uVar18 - 8)) = local_e8._0_8_;
                    *(char **)((data_ptr_t)((long)pVVar11 + (uVar18 - 8)) + 8) =
                         local_e8.pointer.ptr;
                    uVar15 = uVar15 + 1;
                    uVar18 = uVar18 + 0x10;
                    iVar23 = extraout_RDX_06;
                    uVar27 = uVar22;
                    pdVar20 = local_120;
                  } while (uVar22 != uVar15);
                }
              }
              else {
                uVar18 = puVar4[(long)local_128];
                uVar22 = uVar15 + 0x40;
                if (local_118 <= uVar15 + 0x40) {
                  uVar22 = local_118;
                }
                pdVar19 = local_110;
                uVar27 = uVar22;
                if (uVar18 != 0) {
                  if (uVar18 == 0xffffffffffffffff) goto LAB_01adc559;
                  uVar27 = uVar15;
                  pdVar20 = local_120;
                  if (uVar15 < uVar22) {
                    uVar24 = uVar15 << 4 | 8;
                    uVar21 = 0;
                    do {
                      if ((uVar18 >> (uVar21 & 0x3f) & 1) != 0) {
                        local_a0._0_8_ = *(undefined8 *)(local_f8 + (uVar24 - 8));
                        local_a0.pointer.ptr = (char *)*(undefined8 *)(local_f8 + uVar24);
                        local_138 = *(undefined1 (*) [16])(local_110 + (uVar24 - 8));
                        local_e8.pointer =
                             (anon_struct_16_3_d7536bce_for_pointer)
                             StringVector::EmptyString
                                       ((StringVector *)result,
                                        (Vector *)(local_a0._0_8_ & 0xffffffff),(idx_t)local_110);
                        Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                                        (bitstring_t *)&local_e8.pointer);
                        *(undefined8 *)((long)local_100 + (uVar24 - 8)) = local_e8._0_8_;
                        *(char **)((data_ptr_t)((long)local_100 + (uVar24 - 8)) + 8) =
                             local_e8.pointer.ptr;
                        iVar23 = extraout_RDX_07;
                      }
                      uVar21 = uVar21 + 1;
                      uVar24 = uVar24 + 0x10;
                      pdVar19 = local_110;
                      uVar27 = uVar22;
                      pdVar20 = local_120;
                    } while (uVar22 - uVar15 != uVar21);
                  }
                }
              }
              local_128 = (data_ptr_t)((long)local_128 + 1);
              uVar15 = uVar27;
            } while (local_128 != pdVar20);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e8.pointer);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_a0.pointer);
          Vector::ToUnifiedFormat(vector,iVar23,(UnifiedVectorFormat *)&local_e8.pointer);
          Vector::ToUnifiedFormat(vector_00,iVar23,(UnifiedVectorFormat *)&local_a0.pointer);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar19 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_90 == 0 && local_d8 == 0) {
            if (iVar23 != 0) {
              lVar25 = *(long *)local_e8._0_8_;
              lVar5 = *(long *)local_a0._0_8_;
              pdVar19 = pdVar19 + 8;
              iVar23 = 0;
              do {
                iVar12 = iVar23;
                if (lVar25 != 0) {
                  iVar12 = (idx_t)*(uint *)(lVar25 + iVar23 * 4);
                }
                iVar16 = iVar23;
                if (lVar5 != 0) {
                  iVar16 = (idx_t)*(uint *)(lVar5 + iVar23 * 4);
                }
                local_58._0_8_ = *(undefined8 *)(local_e8.pointer.ptr + iVar12 * 0x10);
                local_58.pointer.ptr =
                     (char *)*(undefined8 *)(local_e8.pointer.ptr + iVar12 * 0x10 + 8);
                local_40._0_8_ = *(undefined8 *)(local_a0.pointer.ptr + iVar16 * 0x10);
                local_40.pointer.ptr =
                     (char *)*(undefined8 *)(local_a0.pointer.ptr + iVar16 * 0x10 + 8);
                local_138 = (undefined1  [16])
                            StringVector::EmptyString
                                      ((StringVector *)result,
                                       (Vector *)(local_58._0_8_ & 0xffffffff),local_58._0_8_);
                Bit::BitwiseXor((bitstring_t *)&local_58.pointer,(bitstring_t *)&local_40.pointer,
                                (bitstring_t *)local_138);
                *(undefined8 *)(pdVar19 + -8) = local_138._0_8_;
                *(undefined8 *)pdVar19 = local_138._8_8_;
                iVar23 = iVar23 + 1;
                pdVar19 = pdVar19 + 0x10;
              } while (local_118 != iVar23);
            }
          }
          else if (iVar23 != 0) {
            lVar25 = *(long *)local_e8._0_8_;
            lVar5 = *(long *)local_a0._0_8_;
            pdVar19 = pdVar19 + 8;
            uVar15 = 0;
            do {
              uVar22 = uVar15;
              if (lVar25 != 0) {
                uVar22 = (ulong)*(uint *)(lVar25 + uVar15 * 4);
              }
              uVar18 = uVar15;
              if (lVar5 != 0) {
                uVar18 = (ulong)*(uint *)(lVar5 + uVar15 * 4);
              }
              if (((local_d8 == 0) ||
                  ((*(ulong *)(local_d8 + (uVar22 >> 6) * 8) >> (uVar22 & 0x3f) & 1) != 0)) &&
                 ((local_90 == 0 ||
                  ((*(ulong *)(local_90 + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) & 1) != 0)))) {
                local_58._0_8_ = *(undefined8 *)(local_e8.pointer.ptr + uVar22 * 0x10);
                local_58.pointer.ptr =
                     (char *)*(undefined8 *)(local_e8.pointer.ptr + uVar22 * 0x10 + 8);
                local_40._0_8_ = *(undefined8 *)(local_a0.pointer.ptr + uVar18 * 0x10);
                local_40.pointer.ptr =
                     (char *)*(undefined8 *)(local_a0.pointer.ptr + uVar18 * 0x10 + 8);
                local_138 = (undefined1  [16])
                            StringVector::EmptyString
                                      ((StringVector *)result,
                                       (Vector *)(local_58._0_8_ & 0xffffffff),local_58._0_8_);
                Bit::BitwiseXor((bitstring_t *)&local_58.pointer,(bitstring_t *)&local_40.pointer,
                                (bitstring_t *)local_138);
                *(undefined8 *)(pdVar19 + -8) = local_138._0_8_;
                *(undefined8 *)pdVar19 = local_138._8_8_;
              }
              else {
                _Var14._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var14._M_head_impl == (unsigned_long *)0x0) {
                  local_58._0_8_ =
                       (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_138,(unsigned_long *)&local_58);
                  uVar9 = local_138._0_8_;
                  uVar10 = local_138._8_8_;
                  local_138 = ZEXT816(0);
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)uVar9;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
                    }
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var14._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var14._M_head_impl;
                }
                bVar7 = (byte)uVar15 & 0x3f;
                _Var14._M_head_impl[uVar15 >> 6] =
                     _Var14._M_head_impl[uVar15 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              uVar15 = uVar15 + 1;
              pdVar19 = pdVar19 + 0x10;
            } while (local_118 != uVar15);
          }
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
          }
        }
        return;
      }
      local_108 = (anon_struct_16_3_d7536bce_for_pointer *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_128 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        local_120 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar23 == 0) {
            return;
          }
          uVar15._0_4_ = local_108->length;
          uVar15._4_1_ = local_108->prefix[0];
          uVar15._5_1_ = local_108->prefix[1];
          uVar15._6_1_ = local_108->prefix[2];
          uVar15._7_1_ = local_108->prefix[3];
          pcVar6 = local_108->ptr;
          lVar25 = 8;
          iVar23 = extraout_RDX_01;
          do {
            local_138 = *(undefined1 (*) [16])(local_128 + lVar25 + -8);
            local_a0._0_8_ = uVar15;
            local_a0.pointer.ptr = pcVar6;
            local_e8.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString
                           ((StringVector *)result,(Vector *)(uVar15 & 0xffffffff),iVar23);
            Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                            (bitstring_t *)&local_e8.pointer);
            *(undefined8 *)(local_120 + lVar25 + -8) = local_e8._0_8_;
            *(char **)(local_120 + lVar25 + -8 + 8) = local_e8.pointer.ptr;
            lVar25 = lVar25 + 0x10;
            local_118 = local_118 - 1;
            iVar23 = extraout_RDX_08;
          } while (local_118 != 0);
          return;
        }
        if (iVar23 + 0x3f < 0x40) {
          return;
        }
        uVar15 = iVar23 + 0x3f >> 6;
        local_f0 = 0;
        uVar22 = 0;
        local_48 = uVar15;
        do {
          pdVar20 = local_120;
          pdVar19 = local_128;
          paVar17 = &local_a0;
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar18 = uVar22 + 0x40;
            if (local_118 <= uVar22 + 0x40) {
              uVar18 = local_118;
            }
LAB_01adc2d3:
            uVar24 = uVar22;
            if (uVar22 < uVar18) {
              local_f8._0_4_ = local_108->length;
              local_f8._4_1_ = local_108->prefix[0];
              local_f8._5_1_ = local_108->prefix[1];
              local_f8._6_1_ = local_108->prefix[2];
              local_f8._7_1_ = local_108->prefix[3];
              local_110 = (data_ptr_t)local_108->ptr;
              local_100 = (Vector *)((ulong)local_f8 & 0xffffffff);
              uVar27 = uVar22 << 4 | 8;
              len = paVar17;
              do {
                local_138 = *(undefined1 (*) [16])(pdVar19 + (uVar27 - 8));
                local_a0._0_8_ = local_f8;
                local_a0.pointer.ptr = (char *)local_110;
                local_e8.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringVector::EmptyString((StringVector *)result,local_100,(idx_t)len);
                Bit::BitwiseXor((bitstring_t *)&paVar17->pointer,(bitstring_t *)local_138,
                                (bitstring_t *)&local_e8.pointer);
                pdVar1 = pdVar20 + (uVar27 - 8);
                *(undefined8 *)pdVar1 = local_e8._0_8_;
                *(char **)(pdVar1 + 8) = local_e8.pointer.ptr;
                uVar22 = uVar22 + 1;
                uVar27 = uVar27 + 0x10;
                uVar15 = local_48;
                len = extraout_RDX_03;
                uVar24 = uVar18;
              } while (uVar18 != uVar22);
            }
          }
          else {
            uVar27 = puVar4[local_f0];
            uVar18 = uVar22 + 0x40;
            if (local_118 <= uVar22 + 0x40) {
              uVar18 = local_118;
            }
            uVar24 = uVar18;
            if (uVar27 != 0) {
              if (uVar27 == 0xffffffffffffffff) goto LAB_01adc2d3;
              uVar24 = uVar22;
              if (uVar22 < uVar18) {
                uVar21 = uVar22 << 4 | 8;
                uVar26 = 0;
                do {
                  if ((uVar27 >> (uVar26 & 0x3f) & 1) != 0) {
                    local_a0._0_4_ = local_108->length;
                    local_a0._4_1_ = local_108->prefix[0];
                    local_a0._5_1_ = local_108->prefix[1];
                    local_a0._6_1_ = local_108->prefix[2];
                    local_a0._7_1_ = local_108->prefix[3];
                    local_a0.pointer.ptr = local_108->ptr;
                    local_138 = *(undefined1 (*) [16])(pdVar19 + (uVar21 - 8));
                    local_e8.pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)
                         StringVector::EmptyString
                                   ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),
                                    (idx_t)paVar17);
                    Bit::BitwiseXor((bitstring_t *)&local_a0.pointer,(bitstring_t *)local_138,
                                    (bitstring_t *)&local_e8.pointer);
                    pdVar1 = pdVar20 + (uVar21 - 8);
                    *(undefined8 *)pdVar1 = local_e8._0_8_;
                    *(char **)(pdVar1 + 8) = local_e8.pointer.ptr;
                    paVar17 = extraout_RDX_02;
                  }
                  uVar26 = uVar26 + 1;
                  uVar21 = uVar21 + 0x10;
                  uVar15 = local_48;
                  uVar24 = uVar18;
                } while (uVar18 - uVar22 != uVar26);
              }
            }
          }
          local_f0 = local_f0 + 1;
          uVar22 = uVar24;
          if (local_f0 == uVar15) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitwiseXOROperation(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t rhs, string_t lhs) {
		    string_t target = StringVector::EmptyString(result, rhs.GetSize());

		    Bit::BitwiseXor(rhs, lhs, target);
		    return target;
	    });
}